

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,xpath_node *xn,xpath_allocator *alloc)

{
  xml_node xVar1;
  
  xVar1 = xpath_node::node(xn);
  if (xVar1._root == (xml_node_struct *)0x0) {
    if (((xn->_attribute)._attr != (xml_attribute_struct *)0x0) &&
       (xVar1 = xpath_node::parent(xn), xVar1._root != (xml_node_struct *)0x0)) {
      xVar1 = xpath_node::parent(xn);
      goto LAB_00698e90;
    }
  }
  else {
    xVar1 = xpath_node::node(xn);
    xVar1._root = (xVar1._root)->parent;
    if (xVar1._root != (xml_node_struct *)0x0) {
LAB_00698e90:
      step_push(this,ns,xVar1._root,alloc);
      return;
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}